

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O1

void __thiscall
kj::Maybe<kj::AuthenticatedStream>::Maybe
          (Maybe<kj::AuthenticatedStream> *this,Maybe<kj::AuthenticatedStream> *other)

{
  bool bVar1;
  PeerIdentity *pPVar2;
  Disposer *pDVar3;
  AsyncIoStream *pAVar4;
  
  bVar1 = (other->ptr).isSet;
  (this->ptr).isSet = bVar1;
  if (bVar1 == true) {
    (this->ptr).field_1.value.stream.disposer = (other->ptr).field_1.value.stream.disposer;
    (this->ptr).field_1.value.stream.ptr = (other->ptr).field_1.value.stream.ptr;
    (other->ptr).field_1.value.stream.ptr = (AsyncIoStream *)0x0;
    (this->ptr).field_1.value.peerIdentity.disposer =
         (other->ptr).field_1.value.peerIdentity.disposer;
    (this->ptr).field_1.value.peerIdentity.ptr = (other->ptr).field_1.value.peerIdentity.ptr;
    (other->ptr).field_1.value.peerIdentity.ptr = (PeerIdentity *)0x0;
  }
  if ((other->ptr).isSet == true) {
    (other->ptr).isSet = false;
    pPVar2 = (other->ptr).field_1.value.peerIdentity.ptr;
    if (pPVar2 != (PeerIdentity *)0x0) {
      (other->ptr).field_1.value.peerIdentity.ptr = (PeerIdentity *)0x0;
      pDVar3 = (other->ptr).field_1.value.peerIdentity.disposer;
      (**pDVar3->_vptr_Disposer)
                (pDVar3,pPVar2->_vptr_PeerIdentity[-2] + (long)&pPVar2->_vptr_PeerIdentity);
    }
    pAVar4 = (other->ptr).field_1.value.stream.ptr;
    if (pAVar4 != (AsyncIoStream *)0x0) {
      (other->ptr).field_1.value.stream.ptr = (AsyncIoStream *)0x0;
      pDVar3 = (other->ptr).field_1.value.stream.disposer;
      (**pDVar3->_vptr_Disposer)
                (pDVar3,(pAVar4->super_AsyncInputStream)._vptr_AsyncInputStream[-2] +
                        (long)&(pAVar4->super_AsyncInputStream)._vptr_AsyncInputStream);
    }
  }
  return;
}

Assistant:

Maybe(Maybe&& other): ptr(kj::mv(other.ptr)) { other = kj::none; }